

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

string * __thiscall
t_st_generator::write_val
          (string *__return_storage_ptr__,t_st_generator *this,t_type *t,string *fname)

{
  int iVar1;
  t_struct *tstruct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  tstruct = (t_struct *)t_type::get_true_type(t);
  iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0x10])(tstruct);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xb])(tstruct);
      if (((char)iVar1 == '\0') &&
         (iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xc])(tstruct),
         (char)iVar1 == '\0')) {
        iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xe])(tstruct);
        if ((char)iVar1 == '\0') {
          iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xf])(tstruct);
          if ((char)iVar1 == '\0') {
            iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct);
            if ((char)iVar1 != '\0') {
              std::operator+(__return_storage_ptr__,"iprot writeI32: ",fname);
              return __return_storage_ptr__;
            }
            __return_storage_ptr___00 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
            type_name_abi_cxx11_(&local_170,this,(t_type *)tstruct);
            std::operator+(__return_storage_ptr___00,"Sorry, I don\'t know how to write this: ",
                           &local_170);
            __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                        std::__cxx11::string::~string);
          }
          std::__cxx11::string::string((string *)&local_f0,(string *)fname);
          set_writer(__return_storage_ptr__,this,(t_set *)tstruct,&local_f0);
          this_00 = &local_f0;
        }
        else {
          std::__cxx11::string::string((string *)&local_d0,(string *)fname);
          list_writer(__return_storage_ptr__,this,(t_list *)tstruct,&local_d0);
          this_00 = &local_d0;
        }
      }
      else {
        std::__cxx11::string::string((string *)&local_b0,(string *)fname);
        struct_writer(__return_storage_ptr__,this,tstruct,&local_b0);
        this_00 = &local_b0;
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_90,(string *)fname);
      map_writer(__return_storage_ptr__,this,(t_map *)tstruct,&local_90);
      this_00 = &local_90;
    }
  }
  else {
    iVar1 = *(int *)&(tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
    if (iVar1 - 3U < 4) {
      type_name_abi_cxx11_(&local_50,this,(t_type *)tstruct);
      t_generator::capitalize(&local_110,(t_generator *)this,&local_50);
      std::operator+(&local_150,"iprot write",&local_110);
      std::operator+(&local_130,&local_150,": ");
      std::operator+(&local_170,&local_130,fname);
      std::operator+(__return_storage_ptr__,&local_170," asInteger");
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_110);
      this_00 = &local_50;
    }
    else if (iVar1 == 7) {
      std::operator+(&local_170,"iprot writeDouble: ",fname);
      std::operator+(__return_storage_ptr__,&local_170," asFloat");
      this_00 = &local_170;
    }
    else {
      type_name_abi_cxx11_(&local_70,this,(t_type *)tstruct);
      t_generator::capitalize(&local_150,(t_generator *)this,&local_70);
      std::operator+(&local_130,"iprot write",&local_150);
      std::operator+(&local_170,&local_130,": ");
      std::operator+(__return_storage_ptr__,&local_170,fname);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      this_00 = &local_70;
    }
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::write_val(t_type* t, string fname) {
  t = get_true_type(t);

  if (t->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)t)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_DOUBLE:
      return "iprot writeDouble: " + fname + " asFloat";
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      return "iprot write" + capitalize(type_name(t)) + ": " + fname + " asInteger";
    default:
      return "iprot write" + capitalize(type_name(t)) + ": " + fname;
    }
  } else if (t->is_map()) {
    return map_writer((t_map*)t, fname);
  } else if (t->is_struct() || t->is_xception()) {
    return struct_writer((t_struct*)t, fname);
  } else if (t->is_list()) {
    return list_writer((t_list*)t, fname);
  } else if (t->is_set()) {
    return set_writer((t_set*)t, fname);
  } else if (t->is_enum()) {
    return "iprot writeI32: " + fname;
  } else {
    throw "Sorry, I don't know how to write this: " + type_name(t);
  }
}